

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_trans_single_path.cpp
# Opt level: O1

void __thiscall agg::trans_single_path::transform(trans_single_path *this,double *x,double *y)

{
  vertex_dist *pvVar1;
  vertex_dist **ppvVar2;
  vertex_dist *pvVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  
  if (this->m_status == ready) {
    if (1e-10 < this->m_base_length) {
      uVar4 = (this->m_src_vertices).super_pod_bvector<agg::vertex_dist,_6U>.m_size - 1;
      *x = ((this->m_src_vertices).super_pod_bvector<agg::vertex_dist,_6U>.m_blocks[uVar4 >> 6]
            [uVar4 & 0x3f].dist / this->m_base_length) * *x;
    }
    dVar8 = *x;
    if (0.0 <= dVar8) {
      uVar7 = (this->m_src_vertices).super_pod_bvector<agg::vertex_dist,_6U>.m_size;
      uVar4 = uVar7 - 1;
      uVar6 = (ulong)uVar4;
      ppvVar2 = (this->m_src_vertices).super_pod_bvector<agg::vertex_dist,_6U>.m_blocks;
      dVar9 = ppvVar2[uVar4 >> 6][uVar4 & 0x3f].dist;
      if (dVar8 <= dVar9) {
        if (this->m_preserve_x_scale == true) {
          uVar5 = 0;
          if (1 < uVar4) {
            uVar5 = 0;
            do {
              uVar7 = (int)uVar6 + (int)uVar5;
              uVar4 = uVar7 >> 1;
              if (dVar8 < ppvVar2[uVar7 >> 7][uVar4 & 0x3f].dist) {
                uVar6 = (ulong)uVar4;
              }
              else {
                uVar5 = (ulong)uVar4;
              }
            } while (1 < (uint)((int)uVar6 - (int)uVar5));
          }
          uVar4 = (uint)uVar5;
          uVar7 = (uint)uVar6;
          dVar9 = ppvVar2[uVar6 >> 6][uVar7 & 0x3f].dist - ppvVar2[uVar5 >> 6][uVar4 & 0x3f].dist;
          dVar8 = dVar8 - ppvVar2[uVar5 >> 6][uVar4 & 0x3f].dist;
        }
        else {
          dVar8 = dVar8 * this->m_kindex;
          uVar6 = (ulong)dVar8;
          uVar4 = (uint)uVar6;
          uVar7 = uVar4 + 1;
          dVar9 = ppvVar2[uVar7 >> 6][uVar7 & 0x3f].dist -
                  ppvVar2[uVar6 >> 6 & 0x3ffffff][uVar4 & 0x3f].dist;
          dVar8 = (dVar8 - (double)(uVar6 & 0xffffffff)) * dVar9;
        }
        dVar11 = ppvVar2[uVar4 >> 6][uVar4 & 0x3f].x;
        dVar10 = ppvVar2[uVar4 >> 6][uVar4 & 0x3f].y;
        dVar12 = ppvVar2[uVar7 >> 6][uVar7 & 0x3f].x - dVar11;
        dVar13 = ppvVar2[uVar7 >> 6][uVar7 & 0x3f].y - dVar10;
      }
      else {
        pvVar1 = ppvVar2[uVar4 >> 6] + (uVar4 & 0x3f);
        uVar7 = uVar7 - 2;
        dVar11 = pvVar1->x;
        pvVar3 = ppvVar2[uVar7 >> 6];
        uVar7 = uVar7 & 0x3f;
        dVar12 = dVar11 - pvVar3[uVar7].x;
        dVar10 = pvVar1->y;
        dVar13 = dVar10 - pvVar3[uVar7].y;
        dVar8 = dVar8 - dVar9;
        dVar9 = dVar9 - pvVar3[uVar7].dist;
      }
    }
    else {
      pvVar1 = *(this->m_src_vertices).super_pod_bvector<agg::vertex_dist,_6U>.m_blocks;
      dVar11 = pvVar1->x;
      dVar10 = pvVar1->y;
      dVar12 = pvVar1[1].x - dVar11;
      dVar13 = pvVar1[1].y - dVar10;
      dVar9 = pvVar1[1].dist - pvVar1->dist;
    }
    *x = ((dVar8 * dVar12) / dVar9 + dVar11) - (dVar13 * *y) / dVar9;
    *y = (dVar12 * *y) / dVar9 + (dVar8 * dVar13) / dVar9 + dVar10;
  }
  return;
}

Assistant:

void trans_single_path::transform(double *x, double *y) const
    {
        if(m_status == ready)
        {
            if(m_base_length > 1e-10)
            {
                *x *= m_src_vertices[m_src_vertices.size() - 1].dist / 
                      m_base_length;
            }

            double x1 = 0.0;
            double y1 = 0.0;
            double dx = 1.0;
            double dy = 1.0;
            double d  = 0.0;
            double dd = 1.0;
            if(*x < 0.0)
            {
                // Extrapolation on the left
                //--------------------------
                x1 = m_src_vertices[0].x;
                y1 = m_src_vertices[0].y;
                dx = m_src_vertices[1].x - x1;
                dy = m_src_vertices[1].y - y1;
                dd = m_src_vertices[1].dist - m_src_vertices[0].dist;
                d  = *x;
            }
            else
            if(*x > m_src_vertices[m_src_vertices.size() - 1].dist)
            {
                // Extrapolation on the right
                //--------------------------
                unsigned i = m_src_vertices.size() - 2;
                unsigned j = m_src_vertices.size() - 1;
                x1 = m_src_vertices[j].x;
                y1 = m_src_vertices[j].y;
                dx = x1 - m_src_vertices[i].x;
                dy = y1 - m_src_vertices[i].y;
                dd = m_src_vertices[j].dist - m_src_vertices[i].dist;
                d  = *x - m_src_vertices[j].dist;
            }
            else
            {
                // Interpolation
                //--------------------------
                unsigned i = 0;
                unsigned j = m_src_vertices.size() - 1;
                if(m_preserve_x_scale)
                {
                    unsigned k;
                    for(i = 0; (j - i) > 1; ) 
                    {
                        if(*x < m_src_vertices[k = (i + j) >> 1].dist) 
                        {
                            j = k; 
                        }
                        else 
                        {
                            i = k;
                        }
                    }
                    d  = m_src_vertices[i].dist;
                    dd = m_src_vertices[j].dist - d;
                    d  = *x - d;
                }
                else
                {
                    i = unsigned(*x * m_kindex);
                    j = i + 1;
                    dd = m_src_vertices[j].dist - m_src_vertices[i].dist;
                    d = ((*x * m_kindex) - i) * dd;
                }
                x1 = m_src_vertices[i].x;
                y1 = m_src_vertices[i].y;
                dx = m_src_vertices[j].x - x1;
                dy = m_src_vertices[j].y - y1;
            }
            double x2 = x1 + dx * d / dd;
            double y2 = y1 + dy * d / dd;
            *x = x2 - *y * dy / dd;
            *y = y2 + *y * dx / dd;
        }
    }